

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation_options.hpp
# Opt level: O0

string * jsoncons::jsonschema::schema_version::draft201909_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  allocator<char> *unaff_retaddr;
  char *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  allocator<char> local_9 [9];
  
  if (draft201909[abi:cxx11]()::s_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&draft201909[abi:cxx11]()::s_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_00000010,in_stack_00000008,unaff_retaddr);
      std::allocator<char>::~allocator(local_9);
      __cxa_atexit(std::__cxx11::string::~string,&draft201909[abi:cxx11]()::s_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&draft201909[abi:cxx11]()::s_abi_cxx11_);
    }
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)&draft201909[abi:cxx11]()::s_abi_cxx11_);
  return in_RDI;
}

Assistant:

static std::string draft201909() 
        {
            static std::string s{"https://json-schema.org/draft/2019-09/schema"};
            return s;
        }